

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::meshsurface(tetgenmesh *this)

{
  point *ppdVar1;
  bool bVar2;
  verttype vVar3;
  int iVar4;
  arraypool *paVar5;
  polygon *ppVar6;
  facet *pfVar7;
  int local_9c;
  int local_6c;
  uint local_68;
  int j;
  int i;
  int shmark;
  int end2;
  int end1;
  polygon *p;
  facet *f;
  point *cons;
  point *pnewpt;
  point tend;
  point tstart;
  point *idx2verlist;
  arraypool *conlist;
  arraypool *ptlist;
  tetgenmesh *this_local;
  
  ptlist = (arraypool *)this;
  if (this->b->quiet == 0) {
    printf("Creating surface mesh ...\n");
  }
  makeindex2pointmap(this,(point **)&tstart);
  paVar5 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar5,8,8);
  conlist = paVar5;
  paVar5 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(paVar5,0x10,8);
  j = 1;
  idx2verlist = (point *)paVar5;
  do {
    if (this->in->numberoffacets < j) {
      if (this->b->diagnose == 0) {
        unifysegments(this);
        if (0 < this->in->numberofedges) {
          identifyinputedges(this,(point *)tstart);
        }
        if (((this->b->psc == 0) && (this->b->nomergefacet == 0)) &&
           ((this->b->nobisect == 0 ||
            ((this->b->nobisect != 0 && (this->b->nobisect_nomerge == 0)))))) {
          mergefacets(this);
        }
      }
      if (this->b->object == STL) {
        jettisonnodes(this);
      }
      if (this->b->verbose != 0) {
        printf("  %ld (%ld) subfaces (segments).\n",this->subfaces->items,this->subsegs->items);
      }
      this->insegments = this->subsegs->items;
      if (tstart != (point)0x0) {
        operator_delete__(tstart);
      }
      paVar5 = conlist;
      if (conlist != (arraypool *)0x0) {
        arraypool::~arraypool(conlist);
        operator_delete(paVar5,0x30);
      }
      ppdVar1 = idx2verlist;
      if (idx2verlist != (point *)0x0) {
        arraypool::~arraypool((arraypool *)idx2verlist);
        operator_delete(ppdVar1,0x30);
      }
      return;
    }
    pfVar7 = this->in->facetlist + (j + -1);
    if (0 < this->dupverts) {
      for (local_68 = 0; (int)local_68 < pfVar7->numberofpolygons; local_68 = local_68 + 1) {
        ppVar6 = pfVar7->polygonlist + (int)local_68;
        for (local_6c = 0; local_6c < ppVar6->numberofvertices; local_6c = local_6c + 1) {
          tend = (point)tstart[ppVar6->vertexlist[local_6c]];
          vVar3 = pointtype(this,tend);
          if (vVar3 == DUPLICATEDVERTEX) {
            pnewpt = (point *)point2ppt(this,tend);
            iVar4 = pointmark(this,(point)pnewpt);
            ppVar6->vertexlist[local_6c] = iVar4;
          }
        }
      }
    }
    for (local_68 = 0; (int)local_68 < pfVar7->numberofpolygons; local_68 = local_68 + 1) {
      ppVar6 = pfVar7->polygonlist + (int)local_68;
      shmark = *ppVar6->vertexlist;
      if ((shmark < this->in->firstnumber) ||
         (this->in->firstnumber + this->in->numberofpoints <= shmark)) {
        if (this->b->quiet == 0) {
          printf("Warning:  Invalid the 1st vertex %d of polygon",(ulong)(uint)shmark);
          printf(" %d in facet %d.\n",(ulong)(local_68 + 1),(ulong)(uint)j);
        }
      }
      else {
        tend = (point)tstart[shmark];
        bVar2 = pinfected(this,tend);
        if (!bVar2) {
          pinfect(this,tend);
          arraypool::newindex(conlist,&cons);
          *cons = tend;
        }
        for (local_6c = 1; local_6c <= ppVar6->numberofvertices; local_6c = local_6c + 1) {
          if (local_6c < ppVar6->numberofvertices) {
            i = ppVar6->vertexlist[local_6c];
          }
          else {
            i = *ppVar6->vertexlist;
          }
          if ((i < this->in->firstnumber) || (this->in->firstnumber + this->in->numberofpoints <= i)
             ) {
            if (this->b->quiet == 0) {
              printf("Warning:  Invalid vertex %d in polygon %d",(ulong)(uint)i,
                     (ulong)(local_68 + 1));
              printf(" in facet %d.\n",(ulong)(uint)j);
            }
          }
          else if (shmark == i) {
            if ((2 < ppVar6->numberofvertices) && (this->b->quiet == 0)) {
              printf("Warning:  Polygon %d has two identical verts",(ulong)(local_68 + 1));
              printf(" in facet %d.\n",(ulong)(uint)j);
            }
          }
          else {
            pnewpt = (point *)tstart[i];
            bVar2 = pinfected(this,(point)pnewpt);
            if (!bVar2) {
              pinfect(this,(point)pnewpt);
              arraypool::newindex(conlist,&cons);
              *cons = (point)pnewpt;
            }
            arraypool::newindex((arraypool *)idx2verlist,&f);
            f->polygonlist = (polygon *)tend;
            *(point **)&f->numberofpolygons = pnewpt;
            shmark = i;
            tend = (point)pnewpt;
          }
          if (ppVar6->numberofvertices == 2) break;
        }
      }
    }
    for (local_68 = 0; (long)(int)local_68 < conlist->objects; local_68 = local_68 + 1) {
      cons = (point *)(conlist->toparray
                       [(int)local_68 >> ((byte)conlist->log2objectsperblock & 0x1f)] +
                      (int)((local_68 & conlist->objectsperblockmark) * conlist->objectbytes));
      puninfect(this,*cons);
    }
    if (this->in->facetmarkerlist == (int *)0x0) {
      local_9c = -1;
    }
    else {
      local_9c = this->in->facetmarkerlist[j + -1];
    }
    triangulate(this,local_9c,conlist,(arraypool *)idx2verlist,pfVar7->numberofholes,
                pfVar7->holelist);
    arraypool::restart(conlist);
    arraypool::restart((arraypool *)idx2verlist);
    j = j + 1;
  } while( true );
}

Assistant:

void tetgenmesh::meshsurface()
{
  arraypool *ptlist, *conlist;
  point *idx2verlist;
  point tstart, tend, *pnewpt, *cons;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  int end1, end2;
  int shmark, i, j;

  if (!b->quiet) {
    printf("Creating surface mesh ...\n");
  }

  // Create a map from indices to points.
  makeindex2pointmap(idx2verlist);

  // Initialize arrays (block size: 2^8 = 256).
  ptlist = new arraypool(sizeof(point *), 8);
  conlist = new arraypool(2 * sizeof(point *), 8);

  // Loop the facet list, triangulate each facet.
  for (shmark = 1; shmark <= in->numberoffacets; shmark++) {

    // Get a facet F.
    f = &in->facetlist[shmark - 1];

    // Process the duplicated points first, they are marked with type
    //   DUPLICATEDVERTEX.  If p and q are duplicated, and p'index > q's,
    //   then p is substituted by q.
    if (dupverts > 0l) {
      // Loop all polygons of this facet.
      for (i = 0; i < f->numberofpolygons; i++) {
        p = &(f->polygonlist[i]);
        // Loop other vertices of this polygon.
        for (j = 0; j < p->numberofvertices; j++) {
          end1 = p->vertexlist[j];
          tstart = idx2verlist[end1];
          if (pointtype(tstart) == DUPLICATEDVERTEX) {
            // Reset the index of vertex-j.
            tend = point2ppt(tstart);
            end2 = pointmark(tend);
            p->vertexlist[j] = end2;
          }
        }
      }
    }

    // Loop polygons of F, get the set of vertices and segments.
    for (i = 0; i < f->numberofpolygons; i++) {
      // Get a polygon.
      p = &(f->polygonlist[i]);
      // Get the first vertex.
      end1 = p->vertexlist[0];
      if ((end1 < in->firstnumber) || 
          (end1 >= in->firstnumber + in->numberofpoints)) {
        if (!b->quiet) {
          printf("Warning:  Invalid the 1st vertex %d of polygon", end1);
          printf(" %d in facet %d.\n", i + 1, shmark);
        }
        continue; // Skip this polygon.
      }
      tstart = idx2verlist[end1];
      // Add tstart to V if it haven't been added yet.
      if (!pinfected(tstart)) {
        pinfect(tstart);
        ptlist->newindex((void **) &pnewpt);
        *pnewpt = tstart;
      }
      // Loop other vertices of this polygon.
      for (j = 1; j <= p->numberofvertices; j++) {
        // get a vertex.
        if (j < p->numberofvertices) {
          end2 = p->vertexlist[j];
        } else {
          end2 = p->vertexlist[0];  // Form a loop from last to first.
        }
        if ((end2 < in->firstnumber) ||
            (end2 >= in->firstnumber + in->numberofpoints)) {
          if (!b->quiet) {
            printf("Warning:  Invalid vertex %d in polygon %d", end2, i + 1);
            printf(" in facet %d.\n", shmark);
          }
        } else {
          if (end1 != end2) {
            // 'end1' and 'end2' form a segment.
            tend = idx2verlist[end2];
            // Add tstart to V if it haven't been added yet.
            if (!pinfected(tend)) {
              pinfect(tend);
              ptlist->newindex((void **) &pnewpt);
              *pnewpt = tend;
            }
            // Save the segment in S (conlist).
            conlist->newindex((void **) &cons);
            cons[0] = tstart;
            cons[1] = tend;
            // Set the start for next continuous segment.
            end1 = end2;
            tstart = tend;
          } else {
            // Two identical vertices mean an isolated vertex of F.
            if (p->numberofvertices > 2) {
              // This may be an error in the input, anyway, we can continue
              //   by simply skipping this segment.
              if (!b->quiet) {
                printf("Warning:  Polygon %d has two identical verts", i + 1);
                printf(" in facet %d.\n", shmark);
              }
            } 
            // Ignore this vertex.
          }
        }
        // Is the polygon degenerate (a segment or a vertex)?
        if (p->numberofvertices == 2) break;
      }
    }
    // Unmark vertices.
    for (i = 0; i < ptlist->objects; i++) {
      pnewpt = (point *) fastlookup(ptlist, i);
      puninfect(*pnewpt);
    }

    // Triangulate F into a CDT.
    // If in->facetmarklist is NULL, use the default marker -1. 
    triangulate(in->facetmarkerlist ? in->facetmarkerlist[shmark - 1] : -1,
                ptlist, conlist, f->numberofholes, f->holelist);

    // Clear working lists.
    ptlist->restart();
    conlist->restart();
  }

  if (!b->diagnose) {
    // Remove redundant segments and build the face links.
    unifysegments();
    if (in->numberofedges > 0) { 
      // There are input segments. Insert them.
      identifyinputedges(idx2verlist);
    }
    if (!b->psc && !b->nomergefacet && 
        (!b->nobisect || (b->nobisect && !b->nobisect_nomerge))) {
      // Merge coplanar facets.
      mergefacets();
    }
  }

  if (b->object == tetgenbehavior::STL) {
    // Remove redundant vertices (for .stl input mesh).
    jettisonnodes();
  }

  if (b->verbose) {
    printf("  %ld (%ld) subfaces (segments).\n", subfaces->items, 
           subsegs->items);
  }

  // The total number of iunput segments.
  insegments = subsegs->items;

  delete [] idx2verlist;
  delete ptlist;
  delete conlist;
}